

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFMatrix.cpp
# Opt level: O2

bool __thiscall PDFMatrix::operator==(PDFMatrix *this,PDFMatrix *inOther)

{
  if ((((((this->a == inOther->a) && (!NAN(this->a) && !NAN(inOther->a))) && (this->b == inOther->b)
        ) && ((!NAN(this->b) && !NAN(inOther->b) && (this->c == inOther->c)))) &&
      ((!NAN(this->c) && !NAN(inOther->c) &&
       ((this->d == inOther->d && (!NAN(this->d) && !NAN(inOther->d))))))) &&
     ((this->e == inOther->e && (!NAN(this->e) && !NAN(inOther->e))))) {
    return (bool)(-(inOther->f == this->f) & 1);
  }
  return false;
}

Assistant:

bool PDFMatrix::operator==(const PDFMatrix& inOther) const {
    return a == inOther.a &&
        b == inOther.b &&
        c == inOther.c &&
        d == inOther.d &&
        e == inOther.e &&
        f == inOther.f;
}